

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> *
flat_filter<docopt::OptionsShortcut>
          (vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
           *__return_storage_ptr__,Pattern *pattern)

{
  void *local_30;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> flattened;
  
  (**pattern->_vptr_Pattern)
            (&local_30,pattern,
             flat_filter<docopt::OptionsShortcut>(docopt::Pattern&)::
             {lambda(docopt::Pattern_const*)#1}::Pattern_const__);
  (__return_storage_ptr__->
  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  transform<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,std::back_insert_iterator<std::vector<docopt::OptionsShortcut*,std::allocator<docopt::OptionsShortcut*>>>,flat_filter<docopt::OptionsShortcut>(docopt::Pattern&)::_lambda(docopt::Pattern*)_1_>
            (local_30,flattened.
                      super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> flat_filter(Pattern& pattern) {
	std::vector<Pattern*> flattened = pattern.flat([](Pattern const* p) -> bool {
		return dynamic_cast<T const*>(p) != nullptr;
	});

	// now, we're guaranteed to have T*'s, so just use static_cast
	std::vector<T*> ret;
	std::transform(flattened.begin(), flattened.end(), std::back_inserter(ret), [](Pattern* p) {
		return static_cast<T*>(p);
	});
	return ret;
}